

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_sei.cpp
# Opt level: O3

void write_sei_payload(h264_stream_t *h,bs_t *b,int payloadType,int payloadSize)

{
  byte bVar1;
  sei_t *psVar2;
  byte *pbVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  bool bVar7;
  
  psVar2 = h->sei;
  if (0 < psVar2->payloadSize) {
    iVar4 = b->bits_left;
    lVar5 = 0;
    do {
      bVar1 = psVar2->payload[lVar5];
      uVar6 = 7;
      do {
        iVar4 = iVar4 + -1;
        b->bits_left = iVar4;
        pbVar3 = b->p;
        if (pbVar3 < b->end) {
          *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
          *b->p = *b->p | ((bVar1 >> (uVar6 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
          iVar4 = b->bits_left;
        }
        if (iVar4 == 0) {
          b->p = b->p + 1;
          b->bits_left = 8;
          iVar4 = 8;
        }
        bVar7 = uVar6 != 0;
        uVar6 = uVar6 - 1;
      } while (bVar7);
      lVar5 = lVar5 + 1;
    } while (lVar5 < psVar2->payloadSize);
  }
  return;
}

Assistant:

void write_sei_payload(h264_stream_t* h, bs_t* b, int payloadType, int payloadSize)
{
    sei_t* s = h->sei;

    int i;
    for ( i = 0; i < s->payloadSize; i++ )
        bs_write_u(b, 8, s->payload[i]);
}